

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

size_t __thiscall soul::CodeLocation::getByteOffsetInFile(CodeLocation *this)

{
  char *pcVar1;
  SourceCodeText *pSVar2;
  char *pcVar3;
  long diff;
  CodeLocation *this_local;
  
  pcVar1 = UTF8Reader::getAddress(&this->location);
  pSVar2 = RefCountedPtr<soul::SourceCodeText>::operator->(&this->sourceCode);
  pcVar3 = UTF8Reader::getAddress(&pSVar2->utf8);
  checkAssertion(-1 < (long)pcVar1 - (long)pcVar3,"diff >= 0","getByteOffsetInFile",0x5a);
  return (long)pcVar1 - (long)pcVar3;
}

Assistant:

size_t CodeLocation::getByteOffsetInFile() const
{
    auto diff = location.getAddress() - sourceCode->utf8.getAddress();
    SOUL_ASSERT (diff >= 0);
    return static_cast<size_t> (diff);
}